

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::domain_type::~domain_type(domain_type *this)

{
  element_type *peVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *unaff_retaddr;
  
  peVar1 = std::__shared_ptr_access<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x147cbc);
  peVar1->domain = (domain_type *)0x0;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(unaff_retaddr);
  std::shared_ptr<cs::domain_ref>::~shared_ptr((shared_ptr<cs::domain_ref> *)0x147cdf);
  phmap::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)0x147ce9);
  return;
}

Assistant:

~domain_type()
		{
			m_ref->domain = nullptr;
		}